

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void ws_read_finish(nni_ws *ws)

{
  uint32_t *puVar1;
  nni_list *pnVar2;
  int iVar3;
  nng_err result;
  nni_aio *pnVar4;
  ws_frame *pwVar5;
  size_t sVar6;
  void *pvVar7;
  ulong __n;
  uint local_3c;
  nni_msg *pnStack_38;
  uint niov;
  nni_iov *iov;
  
  if (ws->isstream == true) {
    pnVar2 = &ws->rxq;
    while (pnVar4 = (nni_aio *)nni_list_first(&ws->recvq), pnVar4 != (nni_aio *)0x0) {
      pwVar5 = (ws_frame *)nni_list_first(pnVar2);
      if (pwVar5 == (ws_frame *)0x0) {
        return;
      }
      if (pwVar5->len == 0) {
        nni_list_remove(pnVar2,pwVar5);
        ws_frame_fini(pwVar5);
      }
      else {
        nni_aio_list_remove(pnVar4);
        nni_aio_get_iov(pnVar4,&local_3c,(nni_iov **)&stack0xffffffffffffffc8);
        while ((pwVar5 != (ws_frame *)0x0 && (local_3c != 0))) {
          __n = *(ulong *)(pnStack_38->m_header_buf + 2);
          if (pwVar5->len < *(ulong *)(pnStack_38->m_header_buf + 2)) {
            __n = pwVar5->len;
          }
          if (__n != 0) {
            memcpy(*(void **)pnStack_38->m_header_buf,pwVar5->buf,__n);
            *(ulong *)pnStack_38->m_header_buf = *(long *)pnStack_38->m_header_buf + __n;
            puVar1 = pnStack_38->m_header_buf + 2;
            *(ulong *)puVar1 = *(long *)puVar1 - __n;
            if (*(long *)puVar1 == 0) {
              pnStack_38 = (nni_msg *)(pnStack_38->m_header_buf + 4);
              local_3c = local_3c - 1;
            }
          }
          sVar6 = pwVar5->len - __n;
          if (sVar6 == 0) {
            nni_list_remove(pnVar2,pwVar5);
            ws_frame_fini(pwVar5);
            pwVar5 = (ws_frame *)nni_list_first(pnVar2);
          }
          else {
            pwVar5->len = sVar6;
            pwVar5->buf = pwVar5->buf + __n;
          }
          nni_aio_bump_count(pnVar4,__n);
        }
        sVar6 = nni_aio_count(pnVar4);
        nni_aio_finish(pnVar4,NNG_OK,sVar6);
      }
    }
  }
  else if (ws->inmsg == false) {
    pnVar2 = &ws->rxq;
    iVar3 = nni_list_empty(pnVar2);
    if ((iVar3 == 0) && (pnVar4 = (nni_aio *)nni_list_first(&ws->recvq), pnVar4 != (nni_aio *)0x0))
    {
      pvVar7 = nni_list_first(pnVar2);
      sVar6 = 0;
      for (; pvVar7 != (void *)0x0; pvVar7 = nni_list_next(pnVar2,pvVar7)) {
        sVar6 = sVar6 + *(long *)((long)pvVar7 + 0xa8);
      }
      nni_aio_list_remove(pnVar4);
      result = nni_msg_alloc(&stack0xffffffffffffffc8,sVar6);
      if (result == NNG_OK) {
        pvVar7 = nni_msg_body(pnStack_38);
        while (pwVar5 = (ws_frame *)nni_list_first(pnVar2), pwVar5 != (ws_frame *)0x0) {
          nni_list_remove(pnVar2,pwVar5);
          memcpy(pvVar7,pwVar5->buf,pwVar5->len);
          pvVar7 = (void *)((long)pvVar7 + pwVar5->len);
          ws_frame_fini(pwVar5);
        }
        nni_aio_set_msg(pnVar4,pnStack_38);
        sVar6 = nni_msg_len(pnStack_38);
        nni_aio_bump_count(pnVar4,sVar6);
        sVar6 = nni_msg_len(pnStack_38);
        nni_aio_finish(pnVar4,NNG_OK,sVar6);
      }
      else {
        nni_aio_finish_error(pnVar4,result);
        ws_close_error(ws,0x3f3);
      }
    }
  }
  return;
}

Assistant:

static void
ws_read_finish(nni_ws *ws)
{
	if (ws->isstream) {
		ws_read_finish_str(ws);
	} else {
		ws_read_finish_msg(ws);
	}
}